

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

size_t prt_moves(wchar_t row,wchar_t col)

{
  char *pcVar1;
  int local_20;
  wchar_t local_1c;
  wchar_t local_18;
  wchar_t i;
  wchar_t col_local;
  wchar_t row_local;
  
  local_1c = (player->state).num_moves;
  if (local_1c < L'\x01') {
    if (local_1c < L'\0') {
      local_18 = local_1c;
      if (local_1c < L'\0') {
        local_18 = -local_1c;
      }
      pcVar1 = format("Moves -%d ",(ulong)(uint)local_18);
      c_put_str('\x16',pcVar1,row,col);
    }
  }
  else {
    pcVar1 = format("Moves +%d ",(ulong)(uint)local_1c);
    c_put_str('\x16',pcVar1,row,col);
  }
  if (local_1c == L'\0') {
    local_20 = 0;
  }
  else {
    if (local_1c < L'\0') {
      local_1c = -local_1c;
    }
    local_20 = local_1c / 10 + 9;
  }
  return (long)local_20;
}

Assistant:

static size_t prt_moves(int row, int col)
{
	int i = player->state.num_moves;

	/* 1 move is normal and requires no display */
	if (i > 0) {
		/* Display the number of moves */
		c_put_str(COLOUR_L_TEAL, format("Moves +%d ", i), row, col);
	} else if (i < 0) {
		/* Display the number of moves */
		c_put_str(COLOUR_L_TEAL, format("Moves -%d ", ABS(i)), row, col);
	}

	/* Shouldn't be double digits, but be paranoid */
	return (i != 0) ? (9 + ABS(i) / 10) : 0;
}